

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_setinth(lua_State *L,GCtab *t,int32_t key)

{
  uint uVar1;
  TValue *pTVar2;
  uint uVar3;
  TValue k;
  cTValue local_8;
  
  local_8.n = (lua_Number)key;
  uVar1 = local_8.field_2.it * 2;
  uVar3 = (local_8.u32.lo ^ uVar1) - (local_8.field_2.it << 0xf | uVar1 >> 0x12);
  pTVar2 = (TValue *)
           ((ulong)(t->node).ptr32 +
           (ulong)(((local_8.field_2.it << 0x14 | uVar1 >> 0xd) ^ uVar3) -
                   (uVar3 * 0x2000 | uVar3 >> 0x13) & t->hmask) * 0x18);
  do {
    if (*(uint *)((long)pTVar2 + 0xc) < 0xfffeffff) {
      if ((pTVar2[1].n == local_8.n) && (!NAN(pTVar2[1].n) && !NAN(local_8.n))) {
        return pTVar2;
      }
    }
    pTVar2 = (TValue *)(ulong)pTVar2[2].u32.lo;
    if (pTVar2 == (TValue *)0x0) {
      pTVar2 = lj_tab_newkey(L,t,&local_8);
      return pTVar2;
    }
  } while( true );
}

Assistant:

TValue *lj_tab_setinth(lua_State *L, GCtab *t, int32_t key)
{
  TValue k;
  Node *n;
  k.n = (lua_Number)key;
  n = hashnum(t, &k);
  do {
    if (tvisnum(&n->key) && n->key.n == k.n)
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, &k);
}